

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O0

aiNode * __thiscall Assimp::BVHLoader::ReadNode(BVHLoader *this)

{
  pointer ppaVar1;
  bool bVar2;
  ulong uVar3;
  aiNode *paVar4;
  reference pNode;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar5;
  basic_formatter *pbVar6;
  size_type sVar7;
  iterator __first;
  iterator __last;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  string local_620;
  int local_5fc;
  aiNode *local_5f8;
  aiNode *child_1;
  string local_478;
  string local_458;
  aiNode *local_438;
  aiNode *child;
  string token;
  string siteToken;
  Node *internNode;
  undefined1 local_3b0 [8];
  vector<aiNode_*,_std::allocator<aiNode_*>_> childNodes;
  aiNode *node;
  string local_218;
  undefined1 local_1f8 [8];
  string openBrace;
  string local_60;
  undefined1 local_30 [8];
  string nodeName;
  BVHLoader *this_local;
  
  nodeName.field_2._8_8_ = this;
  GetNextToken_abi_cxx11_((string *)local_30,this);
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) != 0) ||
     (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_30,"{"), bVar2)) {
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&openBrace.field_2 + 8));
    pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        (openBrace.field_2._M_local_buf + 8),
                        (char (*) [32])"Expected node name, but found \"");
    pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_30);
    pbVar6 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar5,(char (*) [3])0xc6b23f);
    Formatter::basic_formatter::operator_cast_to_string(&local_60,pbVar6);
    ThrowException(this,&local_60);
  }
  GetNextToken_abi_cxx11_((string *)local_1f8,this);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1f8,"{");
  if (bVar2) {
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&node);
    pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&node,
                        (char (*) [40])"Expected opening brace \"{\", but found \"");
    pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_1f8);
    pbVar6 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar5,(char (*) [3])0xc6b23f);
    Formatter::basic_formatter::operator_cast_to_string(&local_218,pbVar6);
    ThrowException(this,&local_218);
  }
  paVar4 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(paVar4,(string *)local_30);
  childNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)paVar4;
  std::vector<aiNode_*,_std::allocator<aiNode_*>_>::vector
            ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_3b0);
  Node::Node((Node *)&internNode,
             (aiNode *)
             childNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>::push_back
            (&this->mNodes,(value_type *)&internNode);
  Node::~Node((Node *)&internNode);
  pNode = std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>::back
                    (&this->mNodes);
  std::__cxx11::string::string((string *)(token.field_2._M_local_buf + 8));
  do {
    GetNextToken_abi_cxx11_((string *)&child,this);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &child,"OFFSET");
    if (bVar2) {
      ReadNodeOffset(this,(aiNode *)
                          childNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage);
LAB_005e3c02:
      local_5fc = 0;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &child,"CHANNELS");
      if (bVar2) {
        ReadNodeChannels(this,pNode);
        goto LAB_005e3c02;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &child,"JOINT");
      if (bVar2) {
        local_438 = ReadNode(this);
        local_438->mParent =
             (aiNode *)
             childNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                  ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_3b0,&local_438);
        goto LAB_005e3c02;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &child,"End");
      if (bVar2) {
        std::__cxx11::string::clear();
        GetNextToken_abi_cxx11_(&local_458,this);
        std::__cxx11::string::operator=
                  ((string *)(token.field_2._M_local_buf + 8),(string *)&local_458);
        std::__cxx11::string::~string((string *)&local_458);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(token.field_2._M_local_buf + 8),"Site");
        if (bVar2) {
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &child_1);
          pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                              &child_1,(char (*) [41])"Expected \"End Site\" keyword, but found \"")
          ;
          pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&child);
          pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar5,(char (*) [2])0xc47687);
          pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)((long)&token.field_2 + 8));
          pbVar6 = (basic_formatter *)
                   Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                   operator<<(pbVar5,(char (*) [3])0xc6b23f);
          Formatter::basic_formatter::operator_cast_to_string(&local_478,pbVar6);
          ThrowException(this,&local_478);
        }
        local_5f8 = ReadEndSite(this,(string *)local_30);
        local_5f8->mParent =
             (aiNode *)
             childNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back
                  ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_3b0,&local_5f8);
        goto LAB_005e3c02;
      }
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &child,"}");
      if (!bVar2) {
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter(&local_798);
        pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                            &local_798,(char (*) [18])"Unknown keyword \"");
        pbVar5 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&child);
        pbVar6 = (basic_formatter *)
                 Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                 operator<<(pbVar5,(char (*) [3])0xc6b23f);
        Formatter::basic_formatter::operator_cast_to_string(&local_620,pbVar6);
        ThrowException(this,&local_620);
      }
      local_5fc = 3;
    }
    std::__cxx11::string::~string((string *)&child);
    if (local_5fc != 0) {
      sVar7 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                        ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_3b0);
      if (sVar7 != 0) {
        sVar7 = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::size
                          ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_3b0);
        *(int *)(childNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x8a) = (int)sVar7;
        paVar4 = (aiNode *)
                 operator_new__((ulong)*(uint *)(childNodes.
                                                 super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                + 0x8a) << 3);
        childNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[0x8b] = paVar4;
        __first = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::begin
                            ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_3b0);
        __last = std::vector<aiNode_*,_std::allocator<aiNode_*>_>::end
                           ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_3b0);
        std::
        copy<__gnu_cxx::__normal_iterator<aiNode**,std::vector<aiNode*,std::allocator<aiNode*>>>,aiNode**>
                  ((__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>)
                   __first._M_current,
                   (__normal_iterator<aiNode_**,_std::vector<aiNode_*,_std::allocator<aiNode_*>_>_>)
                   __last._M_current,
                   (aiNode **)
                   childNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage[0x8b]);
      }
      ppaVar1 = childNodes.super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      local_5fc = 1;
      std::__cxx11::string::~string((string *)(token.field_2._M_local_buf + 8));
      std::vector<aiNode_*,_std::allocator<aiNode_*>_>::~vector
                ((vector<aiNode_*,_std::allocator<aiNode_*>_> *)local_3b0);
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::string::~string((string *)local_30);
      return (aiNode *)ppaVar1;
    }
  } while( true );
}

Assistant:

aiNode* BVHLoader::ReadNode()
{
    // first token is name
    std::string nodeName = GetNextToken();
    if( nodeName.empty() || nodeName == "{")
        ThrowException( format() << "Expected node name, but found \"" << nodeName << "\"." );

    // then an opening brace should follow
    std::string openBrace = GetNextToken();
    if( openBrace != "{")
        ThrowException( format() << "Expected opening brace \"{\", but found \"" << openBrace << "\"." );

    // Create a node
    aiNode* node = new aiNode( nodeName);
    std::vector<aiNode*> childNodes;

    // and create an bone entry for it
    mNodes.push_back( Node( node));
    Node& internNode = mNodes.back();

    // now read the node's contents
    std::string siteToken;
    while( 1)
    {
        std::string token = GetNextToken();

        // node offset to parent node
        if( token == "OFFSET")
            ReadNodeOffset( node);
        else if( token == "CHANNELS")
            ReadNodeChannels( internNode);
        else if( token == "JOINT")
        {
            // child node follows
            aiNode* child = ReadNode();
            child->mParent = node;
            childNodes.push_back( child);
        }
        else if( token == "End")
        {
            // The real symbol is "End Site". Second part comes in a separate token
            siteToken.clear();
            siteToken = GetNextToken();
            if( siteToken != "Site")
                ThrowException( format() << "Expected \"End Site\" keyword, but found \"" << token << " " << siteToken << "\"." );

            aiNode* child = ReadEndSite( nodeName);
            child->mParent = node;
            childNodes.push_back( child);
        }
        else if( token == "}")
        {
            // we're done with that part of the hierarchy
            break;
        } else
        {
            // everything else is a parse error
            ThrowException( format() << "Unknown keyword \"" << token << "\"." );
        }
    }

    // add the child nodes if there are any
    if( childNodes.size() > 0)
    {
        node->mNumChildren = static_cast<unsigned int>(childNodes.size());
        node->mChildren = new aiNode*[node->mNumChildren];
        std::copy( childNodes.begin(), childNodes.end(), node->mChildren);
    }

    // and return the sub-hierarchy we built here
    return node;
}